

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallProgramsCommand.cxx
# Opt level: O3

string * __thiscall
cmInstallProgramsCommand::FindInstallSource_abi_cxx11_
          (string *__return_storage_ptr__,cmInstallProgramsCommand *this,char *name)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  size_type sVar3;
  char *pcVar4;
  size_type *psVar5;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar6;
  string ts;
  allocator local_69;
  string local_68;
  _Alloc_hider local_48;
  size_type local_40;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_38;
  
  bVar2 = cmsys::SystemTools::FileIsFullPath(name);
  if (bVar2) {
LAB_00378107:
    std::__cxx11::string::string((string *)__return_storage_ptr__,name,(allocator *)&local_68);
    return __return_storage_ptr__;
  }
  std::__cxx11::string::string((string *)&local_68,name,(allocator *)&local_48);
  sVar3 = cmGeneratorExpression::Find(&local_68);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  if (sVar3 == 0) goto LAB_00378107;
  pcVar4 = cmMakefile::GetCurrentBinaryDirectory((this->super_cmCommand).Makefile);
  std::__cxx11::string::string((string *)&local_68,pcVar4,(allocator *)&local_48);
  std::__cxx11::string::append((char *)&local_68);
  std::__cxx11::string::append((char *)&local_68);
  pcVar4 = cmMakefile::GetCurrentSourceDirectory((this->super_cmCommand).Makefile);
  std::__cxx11::string::string((string *)&local_48,pcVar4,&local_69);
  std::__cxx11::string::append((char *)&local_48);
  std::__cxx11::string::append((char *)&local_48);
  bVar2 = cmsys::SystemTools::FileExists(local_68._M_dataplus._M_p);
  if (bVar2) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p == &local_68.field_2) {
      (__return_storage_ptr__->field_2)._M_allocated_capacity =
           local_68.field_2._M_allocated_capacity;
      *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = local_68.field_2._8_8_;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = local_68._M_dataplus._M_p;
LAB_0037815a:
      (__return_storage_ptr__->field_2)._M_allocated_capacity =
           local_68.field_2._M_allocated_capacity;
    }
  }
  else {
    bVar2 = cmsys::SystemTools::FileExists(local_48._M_p);
    paVar1 = &__return_storage_ptr__->field_2;
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)paVar1;
    if (bVar2) {
      paVar6 = &local_38;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_48._M_p == paVar6) {
        paVar1->_M_allocated_capacity = local_38._M_allocated_capacity;
        *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = local_38._8_8_;
      }
      else {
        (__return_storage_ptr__->_M_dataplus)._M_p = local_48._M_p;
        (__return_storage_ptr__->field_2)._M_allocated_capacity = local_38._M_allocated_capacity;
      }
      psVar5 = &local_40;
      goto LAB_0037818b;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      (__return_storage_ptr__->_M_dataplus)._M_p = local_68._M_dataplus._M_p;
      goto LAB_0037815a;
    }
    paVar1->_M_allocated_capacity = local_68.field_2._M_allocated_capacity;
    *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = local_68.field_2._8_8_;
  }
  paVar6 = &local_68.field_2;
  psVar5 = &local_68._M_string_length;
LAB_0037818b:
  __return_storage_ptr__->_M_string_length = *psVar5;
  (((string *)(psVar5 + -1))->_M_dataplus)._M_p = (pointer)paVar6;
  *psVar5 = 0;
  paVar6->_M_local_buf[0] = '\0';
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_p != &local_38) {
    operator_delete(local_48._M_p,local_38._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p == &local_68.field_2) {
    return __return_storage_ptr__;
  }
  operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  return __return_storage_ptr__;
}

Assistant:

std::string cmInstallProgramsCommand::FindInstallSource(const char* name) const
{
  if (cmSystemTools::FileIsFullPath(name) ||
      cmGeneratorExpression::Find(name) == 0) {
    // This is a full path.
    return name;
  }

  // This is a relative path.
  std::string tb = this->Makefile->GetCurrentBinaryDirectory();
  tb += "/";
  tb += name;
  std::string ts = this->Makefile->GetCurrentSourceDirectory();
  ts += "/";
  ts += name;

  if (cmSystemTools::FileExists(tb.c_str())) {
    // The file exists in the binary tree.  Use it.
    return tb;
  }
  if (cmSystemTools::FileExists(ts.c_str())) {
    // The file exists in the source tree.  Use it.
    return ts;
  }
  // The file doesn't exist.  Assume it will be present in the
  // binary tree when the install occurs.
  return tb;
}